

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionEntryPointInfo::ReleasePendingWorkItem(FunctionEntryPointInfo *this)

{
  code *pcVar1;
  bool bVar2;
  CodeGenWorkItem *workItem;
  undefined4 *puVar3;
  JavascriptLibrary *pJVar4;
  
  bVar2 = EntryPointInfo::IsNotScheduled(&this->super_EntryPointInfo);
  if (!bVar2) {
    bVar2 = EntryPointInfo::IsCleanedUp(&this->super_EntryPointInfo);
    if (!bVar2) {
      workItem = EntryPointInfo::GetWorkItem(&this->super_EntryPointInfo);
      if (workItem != (CodeGenWorkItem *)0x0) {
        pJVar4 = (this->super_EntryPointInfo).library.ptr;
        if (pJVar4 == (JavascriptLibrary *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0x23cf,"(this->library != nullptr)",
                                      "this->library != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
          pJVar4 = (this->super_EntryPointInfo).library.ptr;
        }
        TryReleaseNonHiPriWorkItem((pJVar4->super_JavascriptLibraryBase).scriptContext.ptr,workItem)
        ;
        return;
      }
    }
  }
  return;
}

Assistant:

void FunctionEntryPointInfo::ReleasePendingWorkItem()
    {
        // Do this outside of Cleanup since cleanup can be called from the background thread
        // We remove any work items corresponding to the function body being reclaimed
        // so that the background thread doesn't try to use them. ScriptContext != null => this
        // is a function entry point
        // In general this is not needed for loop bodies since loop bodies aren't in the low priority
        // queue, they should be jitted before the entry point is finalized
        if (!this->IsNotScheduled() && !this->IsCleanedUp())
        {
#if defined(_M_ARM32_OR_ARM64)
            // On ARM machines, order of writes is not guaranteed while reading data from another processor
            // So we need to have a memory barrier here in order to make sure that the work item is consistent
            MemoryBarrier();
#endif
            CodeGenWorkItem* workItem = this->GetWorkItem();
            if (workItem != nullptr)
            {
                Assert(this->library != nullptr);
#if ENABLE_NATIVE_CODEGEN
                TryReleaseNonHiPriWorkItem(this->library->GetScriptContext(), workItem);
#endif
            }
        }
    }